

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_read_filter_row_up(png_row_infop row_info,png_bytep row,png_const_bytep prev_row)

{
  ulong uVar1;
  png_const_bytep local_40;
  png_const_bytep pp;
  png_bytep rp;
  png_size_t istop;
  png_size_t i;
  png_const_bytep prev_row_local;
  png_bytep row_local;
  png_row_infop row_info_local;
  
  uVar1 = row_info->rowbytes;
  local_40 = prev_row;
  pp = row;
  for (istop = 0; istop < uVar1; istop = istop + 1) {
    *pp = *pp + *local_40;
    pp = pp + 1;
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

static void
png_read_filter_row_up(png_row_infop row_info, png_bytep row,
    png_const_bytep prev_row)
{
   png_size_t i;
   png_size_t istop = row_info->rowbytes;
   png_bytep rp = row;
   png_const_bytep pp = prev_row;

   for (i = 0; i < istop; i++)
   {
      *rp = (png_byte)(((int)(*rp) + (int)(*pp++)) & 0xff);
      rp++;
   }
}